

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void once_init(void)

{
  AsyncLogging *this;
  string local_50;
  __shared_ptr<AsyncLogging,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this = (AsyncLogging *)operator_new(0x1e8);
  Logger::getLogFileName_abi_cxx11_();
  AsyncLogging::AsyncLogging(this,&local_50,2);
  std::__shared_ptr<AsyncLogging,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<AsyncLogging,void>
            ((__shared_ptr<AsyncLogging,(__gnu_cxx::_Lock_policy)2> *)&local_30,this);
  std::__shared_ptr<AsyncLogging,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&AsyncLogger_.super___shared_ptr<AsyncLogging,_(__gnu_cxx::_Lock_policy)2>,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  std::__cxx11::string::~string((string *)&local_50);
  AsyncLogging::start(AsyncLogger_.super___shared_ptr<AsyncLogging,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  return;
}

Assistant:

void once_init() {
    AsyncLogger_ = std::shared_ptr<AsyncLogging>(new AsyncLogging(Logger::getLogFileName()));
    AsyncLogger_->start();
}